

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

size_t __thiscall
VulkanHppGenerator::determineInitialSkipCount(VulkanHppGenerator *this,string *command)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  size_type sVar4;
  const_reference pvVar5;
  _Self local_40;
  _Self local_38;
  const_iterator handleIt;
  _Self local_28;
  const_iterator commandIt;
  string *command_local;
  VulkanHppGenerator *this_local;
  
  commandIt._M_node = (_Base_ptr)command;
  local_28._M_node =
       (_Base_ptr)
       anon_unknown.dwarf_b1723::findByNameOrAlias<VulkanHppGenerator::CommandData>
                 (&this->m_commands,command);
  handleIt._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>
       ::end(&this->m_commands);
  bVar1 = std::operator==(&local_28,(_Self *)&handleIt);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("commandIt != m_commands.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x673,
                  "size_t VulkanHppGenerator::determineInitialSkipCount(const std::string &) const")
    ;
  }
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
           ::operator->(&local_28);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
       ::find(&this->m_handles,&(ppVar2->second).handle);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
       ::end(&this->m_handles);
  bVar1 = std::operator==(&local_38,&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("handleIt != m_handles.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x675,
                  "size_t VulkanHppGenerator::determineInitialSkipCount(const std::string &) const")
    ;
  }
  ppVar3 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>
           ::operator->(&local_38);
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::contains(&(ppVar3->second).commands,(key_type *)commandIt._M_node);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>
             ::operator->(&local_38);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&ppVar3->first);
    this_local = (VulkanHppGenerator *)(long)(int)(uint)!bVar1;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
             ::operator->(&local_28);
    sVar4 = std::
            vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
            size(&(ppVar2->second).params);
    if (sVar4 < 2) {
      __assert_fail("1 < commandIt->second.params.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x678,
                    "size_t VulkanHppGenerator::determineInitialSkipCount(const std::string &) const"
                   );
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
             ::operator->(&local_28);
    pvVar5 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             operator[](&(ppVar2->second).params,1);
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
            ::contains(&this->m_handles,&(pvVar5->type).type);
    if (!bVar1) {
      __assert_fail("m_handles.contains( commandIt->second.params[1].type.type )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x679,
                    "size_t VulkanHppGenerator::determineInitialSkipCount(const std::string &) const"
                   );
    }
    this_local = (VulkanHppGenerator *)0x2;
  }
  return (size_t)this_local;
}

Assistant:

size_t VulkanHppGenerator::determineInitialSkipCount( std::string const & command ) const
{
  // determine the number of arguments to skip for a function
  // -> 0: the command is not bound to an instance or a device (the corresponding handle has no name)
  // -> 1: the command bound to an instance or a device (the corresponding handle has a name)
  // -> 2: the command has been moved to a second handle
  auto commandIt = findByNameOrAlias( m_commands, command );
  assert( commandIt != m_commands.end() );
  auto handleIt = m_handles.find( commandIt->second.handle );
  assert( handleIt != m_handles.end() );
  if ( !handleIt->second.commands.contains( command ) )
  {
    assert( 1 < commandIt->second.params.size() );
    assert( m_handles.contains( commandIt->second.params[1].type.type ) );
    return 2;
  }
  else
  {
    return handleIt->first.empty() ? 0 : 1;
  }
}